

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicResourceUBO::Run(BasicResourceUBO *this)

{
  bool bVar1;
  long lVar2;
  uvec3 local_28;
  uvec3 local_1c;
  
  local_1c.m_data[0] = 0x40;
  local_1c.m_data[1] = 1;
  local_1c.m_data[2] = 1;
  local_28.m_data[0] = 8;
  local_28.m_data[1] = 1;
  local_28.m_data[2] = 1;
  bVar1 = RunIteration(this,&local_1c,&local_28,false);
  lVar2 = -1;
  if (bVar1) {
    local_1c.m_data[0] = 2;
    local_1c.m_data[1] = 2;
    local_1c.m_data[2] = 2;
    local_28.m_data[0] = 2;
    local_28.m_data[1] = 2;
    local_28.m_data[2] = 2;
    bVar1 = RunIteration(this,&local_1c,&local_28,true);
    if (bVar1) {
      local_1c.m_data[0] = 2;
      local_1c.m_data[1] = 4;
      local_1c.m_data[2] = 2;
      local_28.m_data[0] = 2;
      local_28.m_data[1] = 4;
      local_28.m_data[2] = 1;
      bVar1 = RunIteration(this,&local_1c,&local_28,false);
      lVar2 = (ulong)bVar1 - 1;
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), uvec3(8, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 2, 2), uvec3(2, 2, 2), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), uvec3(2, 4, 1), false))
			return ERROR;
		return NO_ERROR;
	}